

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS
ref_cell_add_many_global
          (REF_CELL ref_cell,REF_NODE ref_node,REF_INT n,REF_GLOB *c2n,REF_INT *part,
          REF_INT exclude_part_id)

{
  REF_MPI pRVar1;
  uint uVar2;
  REF_GLOB *global_orig;
  clock_t cVar3;
  long lVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  int n_00;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  int iVar11;
  uint local_d4;
  REF_INT new_cell;
  REF_INT local;
  clock_t local_c0;
  double local_b8;
  REF_MPI local_b0;
  REF_INT local_nodes [27];
  
  local_b0 = ref_node->ref_mpi;
  if (local_b0->timing < 0xb) {
    local_c0 = 0;
  }
  else {
    local_c0 = clock();
  }
  iVar11 = ref_cell->node_per;
  if (iVar11 * n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2dc,
           "ref_cell_add_many_global","malloc global of REF_GLOB negative");
    uVar2 = 1;
  }
  else {
    global_orig = (REF_GLOB *)malloc((ulong)(uint)(iVar11 * n) << 3);
    if (global_orig == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2dc,
             "ref_cell_add_many_global","malloc global of REF_GLOB NULL");
      uVar2 = 2;
    }
    else {
      uVar2 = 0;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      uVar9 = 0;
      if (0 < n) {
        uVar9 = n;
      }
      n_00 = 0;
      for (; uVar2 != uVar9; uVar2 = uVar2 + 1) {
        for (lVar4 = 0; iVar11 != (int)lVar4; lVar4 = lVar4 + 1) {
          lVar8 = (long)ref_cell->size_per * (long)(int)uVar2 + lVar4;
          if (part[lVar8] != exclude_part_id) {
            global_orig[n_00] = c2n[lVar8];
            n_00 = n_00 + 1;
          }
        }
      }
      uVar2 = ref_node_add_many(ref_node,n_00,global_orig);
      if (uVar2 == 0) {
        free(global_orig);
        pRVar1 = local_b0;
        local_b8 = 0.0;
        if (10 < local_b0->timing) {
          cVar3 = clock();
          local_b8 = (double)(cVar3 - local_c0);
          if (10 < pRVar1->timing) {
            local_c0 = clock();
          }
        }
        local_d4 = 0;
        for (uVar6 = 0; pRVar1 = local_b0, uVar6 != uVar9; uVar6 = uVar6 + 1) {
          lVar4 = (long)(int)uVar6;
          for (uVar7 = 0; (long)uVar7 < (long)ref_cell->node_per; uVar7 = uVar7 + 1) {
            uVar2 = ref_node_local(ref_node,c2n[ref_cell->size_per * lVar4 + uVar7],&local);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                     ,0x2f3,"ref_cell_add_many_global",(ulong)uVar2,"local");
              printf("node %d %d cell %d %d global %ld\n",uVar7 & 0xffffffff,
                     (ulong)(uint)ref_cell->node_per,(ulong)uVar6,(ulong)(uint)n,
                     c2n[ref_cell->size_per * lVar4 + uVar7]);
              return uVar2;
            }
            ref_node->part[local] = part[ref_cell->size_per * lVar4 + uVar7];
            local_nodes[uVar7] = local;
          }
          if (ref_cell->last_node_is_an_id != 0) {
            iVar11 = ref_cell->size_per;
            local_nodes[(long)iVar11 + -1] = (REF_INT)c2n[(int)(iVar11 * uVar6 + iVar11 + -1)];
          }
          uVar2 = ref_cell_with(ref_cell,local_nodes,&new_cell);
          if ((uVar2 != 0) && (uVar2 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x2fd,"ref_cell_add_many_global",(ulong)uVar2,"with failed");
            local_d4 = uVar2;
          }
          if ((uVar2 != 5) && (uVar2 != 0)) {
            return local_d4;
          }
          if ((new_cell == -1) && (uVar2 = ref_cell_add(ref_cell,local_nodes,&new_cell), uVar2 != 0)
             ) {
            pcVar10 = "add cell";
            uVar5 = 0x300;
            goto LAB_0011cdd7;
          }
        }
        if ((10 < local_b0->timing) && (cVar3 = clock(), 10 < pRVar1->timing)) {
          printf(" node %f cell %f\n",local_b8 / 1000000.0,(double)(cVar3 - local_c0) / 1000000.0);
        }
        uVar2 = 0;
      }
      else {
        pcVar10 = "many nodes";
        uVar5 = 0x2e5;
LAB_0011cdd7:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               uVar5,"ref_cell_add_many_global",(ulong)uVar2,pcVar10);
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_add_many_global(REF_CELL ref_cell,
                                            REF_NODE ref_node, REF_INT n,
                                            REF_GLOB *c2n, REF_INT *part,
                                            REF_INT exclude_part_id) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_GLOB *global;
  REF_INT nnode;
  REF_INT node, cell;
  REF_INT local, local_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  clock_t tic = 0;
  clock_t node_toc = 0;
  clock_t cell_toc = 0;

  if (10 < ref_mpi_timing(ref_mpi)) tic = clock();
  ref_malloc(global, ref_cell_node_per(ref_cell) * n, REF_GLOB);

  nnode = 0;
  for (cell = 0; cell < n; cell++)
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (exclude_part_id != part[node + ref_cell_size_per(ref_cell) * cell]) {
        global[nnode] = c2n[node + ref_cell_size_per(ref_cell) * cell];
        nnode++;
      }
  RSS(ref_node_add_many(ref_node, nnode, global), "many nodes");

  ref_free(global);
  if (10 < ref_mpi_timing(ref_mpi)) node_toc += (clock() - tic);
  if (10 < ref_mpi_timing(ref_mpi)) tic = clock();
  /* set parts */
  for (cell = 0; cell < n; cell++) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      RSB(ref_node_local(
              ref_node, c2n[node + ref_cell_size_per(ref_cell) * cell], &local),
          "local", {
            printf("node %d %d cell %d %d global " REF_GLOB_FMT "\n", node,
                   ref_cell_node_per(ref_cell), cell, n,
                   c2n[node + ref_cell_size_per(ref_cell) * cell]);
          });
      ref_node_part(ref_node, local) =
          part[node + ref_cell_size_per(ref_cell) * cell];
      local_nodes[node] = local;
    }
    if (ref_cell_last_node_is_an_id(ref_cell))
      local_nodes[ref_cell_size_per(ref_cell) - 1] =
          (REF_INT)c2n[(ref_cell_size_per(ref_cell) - 1) +
                       ref_cell_size_per(ref_cell) * cell];
    RXS(ref_cell_with(ref_cell, local_nodes, &new_cell), REF_NOT_FOUND,
        "with failed");

    if (REF_EMPTY == new_cell)
      RSS(ref_cell_add(ref_cell, local_nodes, &new_cell), "add cell");
  }
  if (10 < ref_mpi_timing(ref_mpi)) cell_toc += (clock() - tic);

  if (10 < ref_mpi_timing(ref_mpi)) {
    printf(" node %f cell %f\n",
           ((REF_DBL)node_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)cell_toc) / ((REF_DBL)CLOCKS_PER_SEC));
  }

  return REF_SUCCESS;
}